

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutex.c++
# Opt level: O3

void __thiscall kj::_::Once::reset(Once *this)

{
  bool bVar1;
  Fault f;
  Fault local_10;
  
  LOCK();
  bVar1 = this->futex == 3;
  if (bVar1) {
    this->futex = 0;
  }
  UNLOCK();
  if (!bVar1) {
    Debug::Fault::Fault<kj::Exception::Type,char_const(&)[38]>
              (&local_10,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/mutex.c++"
               ,0x23c,FAILED,(char *)0x0,"\"reset() called while not initialized.\"",
               (char (*) [38])"reset() called while not initialized.");
    Debug::Fault::fatal(&local_10);
  }
  return;
}

Assistant:

void Once::reset() {
  uint state = INITIALIZED;
  if (!__atomic_compare_exchange_n(&futex, &state, UNINITIALIZED,
                                   false, __ATOMIC_RELEASE, __ATOMIC_RELAXED)) {
    KJ_FAIL_REQUIRE("reset() called while not initialized.");
  }
}